

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_sha256.c
# Opt level: O1

int tc_sha256_update(TCSha256State_t s,uint8_t *data,size_t datalen)

{
  uint8_t uVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  
  iVar3 = 0;
  if ((data != (uint8_t *)0x0 && s != (TCSha256State_t)0x0) && (iVar3 = 1, datalen != 0)) {
    sVar4 = 0;
    do {
      uVar1 = data[sVar4];
      sVar2 = s->leftover_offset;
      s->leftover_offset = sVar2 + 1;
      s->leftover[sVar2] = uVar1;
      if (0x3f < s->leftover_offset) {
        compress(s->iv,s->leftover);
        s->leftover_offset = 0;
        s->bits_hashed = s->bits_hashed + 0x200;
      }
      sVar4 = sVar4 + 1;
    } while (datalen != sVar4);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int tc_sha256_update(TCSha256State_t s, const uint8_t *data, size_t datalen)
{
	/* input sanity check: */
	if (s == (TCSha256State_t) 0 ||
	    data == (void *) 0) {
		return TC_CRYPTO_FAIL;
                printf("tc_sha256_update failed, input sanity check.\n");
	} else if (datalen == 0) {
		return TC_CRYPTO_SUCCESS;
	}

	while (datalen-- > 0) {
		s->leftover[s->leftover_offset++] = *(data++);
		if (s->leftover_offset >= TC_SHA256_BLOCK_SIZE) {
			compress(s->iv, s->leftover);
			s->leftover_offset = 0;
			s->bits_hashed += (TC_SHA256_BLOCK_SIZE << 3);
		}
	}

	return TC_CRYPTO_SUCCESS;
}